

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O0

void OPLL_DoModeWrite(opll_t *chip)

{
  byte bVar1;
  uint8_t slot;
  opll_t *chip_local;
  
  if (((chip->write_mode_address & 0x10) != 0) && (chip->write_d_en != '\0')) {
    bVar1 = chip->write_mode_address & 1;
    switch(chip->write_mode_address & 0xf) {
    case 0:
    case 1:
      (chip->patch).multi[bVar1] = chip->write_data & 0xf;
      (chip->patch).ksr[bVar1] = (byte)((int)(uint)chip->write_data >> 4) & 1;
      (chip->patch).et[bVar1] = (byte)((int)(uint)chip->write_data >> 5) & 1;
      (chip->patch).vib[bVar1] = (byte)((int)(uint)chip->write_data >> 6) & 1;
      (chip->patch).am[bVar1] = (uint8_t)((int)(uint)chip->write_data >> 7);
      break;
    case 2:
      (chip->patch).ksl[0] = (uint8_t)((int)(uint)chip->write_data >> 6);
      (chip->patch).tl = chip->write_data & 0x3f;
      break;
    case 3:
      (chip->patch).ksl[1] = (uint8_t)((int)(uint)chip->write_data >> 6);
      (chip->patch).dc = (byte)((int)(uint)chip->write_data >> 4) & 1;
      (chip->patch).dm = (byte)((int)(uint)chip->write_data >> 3) & 1;
      (chip->patch).fb = chip->write_data & 7;
      break;
    case 4:
    case 5:
      (chip->patch).dr[bVar1] = chip->write_data & 0xf;
      (chip->patch).ar[bVar1] = (uint8_t)((int)(uint)chip->write_data >> 4);
      break;
    case 6:
    case 7:
      (chip->patch).rr[bVar1] = chip->write_data & 0xf;
      (chip->patch).sl[bVar1] = (uint8_t)((int)(uint)chip->write_data >> 4);
      break;
    case 0xe:
      chip->rhythm = chip->write_data & 0x3f;
      if (chip->chip_type == 1) {
        chip->rhythm = chip->rhythm | 0x20;
      }
      chip->rm_enable = chip->rm_enable & 0x7fU | (chip->rhythm & 0x20) << 2;
      break;
    case 0xf:
      chip->testmode = chip->write_data & 0xf;
    }
  }
  return;
}

Assistant:

static void OPLL_DoModeWrite(opll_t *chip) {
    if ((chip->write_mode_address & 0x10) && chip->write_d_en) {
        uint8_t slot = chip->write_mode_address & 0x01;
        switch (chip->write_mode_address & 0x0f) {
        case 0x00:
        case 0x01:
            chip->patch.multi[slot] = chip->write_data & 0x0f;
            chip->patch.ksr[slot] = (chip->write_data >> 4) & 0x01;
            chip->patch.et[slot] = (chip->write_data >> 5) & 0x01;
            chip->patch.vib[slot] = (chip->write_data >> 6) & 0x01;
            chip->patch.am[slot] = (chip->write_data >> 7) & 0x01;
            break;

        case 0x02:
            chip->patch.ksl[0] = (chip->write_data >> 6) & 0x03;
            chip->patch.tl = chip->write_data & 0x3f;
            break;

        case 0x03:
            chip->patch.ksl[1] = (chip->write_data >> 6) & 0x03;
            chip->patch.dc = (chip->write_data >> 4) & 0x01;
            chip->patch.dm = (chip->write_data >> 3) & 0x01;
            chip->patch.fb = chip->write_data & 0x07;
            break;

        case 0x04:
        case 0x05:
            chip->patch.dr[slot] = chip->write_data & 0x0f;
            chip->patch.ar[slot] = (chip->write_data >> 4) & 0x0f;
            break;

        case 0x06:
        case 0x07:
            chip->patch.rr[slot] = chip->write_data & 0x0f;
            chip->patch.sl[slot] = (chip->write_data >> 4) & 0x0f;
            break;

        case 0x0e:
            chip->rhythm = chip->write_data & 0x3f;
            if (chip->chip_type == opll_type_ds1001) {
                chip->rhythm |= 0x20;
            }
            chip->rm_enable = (chip->rm_enable & 0x7f) | ((chip->rhythm << 2) & 0x80);
            break;

        case 0x0f:
            chip->testmode = chip->write_data & 0x0f;
            break;
        }
    }
}